

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O1

void __thiscall xemmai::t_list::f_resize(t_list *this)

{
  ulong uVar1;
  t_object *ptVar2;
  __pointer_type ptVar3;
  size_t sVar4;
  t_type *ptVar5;
  t_queue<128UL> *ptVar6;
  t_queue<256UL> *ptVar7;
  t_object *ptVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  long in_FS_OFFSET;
  
  uVar1 = this->v_size * 8 + 0xcf;
  uVar9 = uVar1 & 0xffffffffffffff80;
  uVar13 = uVar9 * 2 - 0x50 >> 3;
  this->v_grow = uVar13;
  uVar12 = 0;
  uVar10 = (uVar9 >> 1) - 0x50 >> 3;
  if (uVar1 < 0x100) {
    uVar10 = uVar12;
  }
  this->v_shrink = uVar10;
  ptVar3 = (this->v_tuple).v_p._M_b._M_p;
  ptVar8 = t_heap<xemmai::t_object>::f_allocate_medium
                     ((t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30),
                      uVar9 * 4 - 0x50);
  ptVar8->v_next = (t_object *)0x0;
  *(ulong *)ptVar8->v_data = uVar13;
  uVar1 = *(ulong *)ptVar3->v_data;
  if (uVar1 < this->v_size + this->v_head) {
    pcVar14 = ptVar8->v_data + 8;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + 1;
      sVar4 = this->v_head;
      this->v_head = sVar4 + 1;
      lVar11 = sVar4 * 0x10;
      t_slot::t_slot((t_slot *)pcVar14,*(t_object **)(ptVar3->v_data + lVar11 + 8));
      *(undefined8 *)(pcVar14 + 8) = *(undefined8 *)(ptVar3->v_data + lVar11 + 0x10);
      pcVar14 = pcVar14 + 0x10;
    } while (this->v_head < uVar1);
    this->v_head = 0;
  }
  pcVar14 = ptVar8->v_data + 8 + uVar12 * 0x10;
  do {
    uVar12 = uVar12 + 1;
    sVar4 = this->v_head;
    this->v_head = sVar4 + 1;
    lVar11 = sVar4 * 0x10;
    t_slot::t_slot((t_slot *)pcVar14,*(t_object **)(ptVar3->v_data + lVar11 + 8));
    *(undefined8 *)(pcVar14 + 8) = *(undefined8 *)(ptVar3->v_data + lVar11 + 0x10);
    pcVar14 = pcVar14 + 0x10;
  } while (uVar12 < this->v_size);
  uVar1 = this->v_grow;
  do {
    uVar12 = uVar12 + 1;
    pcVar14[0] = '\0';
    pcVar14[1] = '\0';
    pcVar14[2] = '\0';
    pcVar14[3] = '\0';
    pcVar14[4] = '\0';
    pcVar14[5] = '\0';
    pcVar14[6] = '\0';
    pcVar14[7] = '\0';
    pcVar14 = pcVar14 + 0x10;
  } while (uVar12 < uVar1);
  ptVar5 = *(t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0x1a8);
  ptVar6 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *ptVar6->v_head = (t_object *)&ptVar5[-1].f_less;
  if (ptVar6->v_head == ptVar6->v_next) {
    t_slot::t_queue<128UL>::f_next(ptVar6);
  }
  else {
    ptVar6->v_head = ptVar6->v_head + 1;
  }
  ptVar8->v_type = ptVar5;
  ptVar7 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *ptVar7->v_head = ptVar8;
  if (ptVar7->v_head == ptVar7->v_next) {
    t_slot::t_queue<256UL>::f_next(ptVar7);
  }
  else {
    ptVar7->v_head = ptVar7->v_head + 1;
  }
  if ((t_object *)0x4 < ptVar8) {
    ptVar6 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *ptVar6->v_head = ptVar8;
    if (ptVar6->v_head == ptVar6->v_next) {
      t_slot::t_queue<128UL>::f_next(ptVar6);
    }
    else {
      ptVar6->v_head = ptVar6->v_head + 1;
    }
  }
  LOCK();
  ptVar2 = (this->v_tuple).v_p._M_b._M_p;
  (this->v_tuple).v_p._M_b._M_p = ptVar8;
  UNLOCK();
  if ((t_object *)0x4 < ptVar2) {
    ptVar7 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *ptVar7->v_head = ptVar2;
    if (ptVar7->v_head == ptVar7->v_next) {
      t_slot::t_queue<256UL>::f_next(ptVar7);
    }
    else {
      ptVar7->v_head = ptVar7->v_head + 1;
    }
  }
  this->v_head = 0;
  return;
}

Assistant:

void t_list::f_resize()
{
	auto size = t_object::f_capacity_to_size<t_tuple, t_slot>(v_size);
	v_grow = t_object::f_size_to_capacity<t_tuple, t_slot>(size * 2);
	v_shrink = size < sizeof(t_object) * 2 ? 0 : t_object::f_size_to_capacity<t_tuple, t_slot>(size / 2);
	auto& tuple0 = v_tuple->f_as<t_tuple>();
	v_tuple = t_tuple::f_instantiate(v_grow, [&](auto& tuple1)
	{
		size_t n = tuple0.f_size();
		size_t i = 0;
		if (v_head + v_size > n) {
			do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (v_head < n);
			v_head = 0;
		}
		do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (i < v_size);
		do new(&tuple1[i++]) t_svalue; while (i < v_grow);
	});
	v_head = 0;
}